

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall Snake::UpdateHead(Snake *this)

{
  __type _Var1;
  Snake *this_local;
  
  switch(this->direction) {
  case kUp:
    this->head_y = this->head_y - this->speed;
    break;
  case kDown:
    this->head_y = this->speed + this->head_y;
    break;
  case kLeft:
    this->head_x = this->head_x - this->speed;
    break;
  case kRight:
    this->head_x = this->speed + this->head_x;
  }
  _Var1 = std::fmod<float,int>(this->head_x + (float)this->grid_width,this->grid_width);
  this->head_x = (float)_Var1;
  _Var1 = std::fmod<float,int>(this->head_y + (float)this->grid_height,this->grid_height);
  this->head_y = (float)_Var1;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}